

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingC.c
# Opt level: O3

wchar_t * cmsysEncoding_DupToWide(char *str)

{
  size_t sVar1;
  wchar_t *__pwcs;
  
  if (str != (char *)0x0) {
    sVar1 = mbstowcs((wchar_t *)0x0,str,0);
    sVar1 = sVar1 + 1;
    if (sVar1 == 0) {
      return (wchar_t *)0x0;
    }
    __pwcs = (wchar_t *)malloc(sVar1 * 4);
    if (__pwcs != (wchar_t *)0x0) {
      *__pwcs = L'\0';
      mbstowcs(__pwcs,str,sVar1);
      return __pwcs;
    }
  }
  return (wchar_t *)0x0;
}

Assistant:

size_t kwsysEncoding_mbstowcs(wchar_t* dest, const char* str, size_t n)
{
  if (str == 0) {
    return (size_t)-1;
  }
#ifdef _WIN32
  return MultiByteToWideChar(KWSYS_ENCODING_DEFAULT_CODEPAGE, 0, str, -1, dest,
                             (int)n) -
    1;
#else
  return mbstowcs(dest, str, n);
#endif
}